

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_invokestatic(ExecutionEngine *this)

{
  cp_info *constantPool_00;
  CONSTANT_Long_info CVar1;
  _Map_pointer this_00;
  bool bVar2;
  VMStack *this_01;
  cp_info **ppcVar3;
  u1 *puVar4;
  char *pcVar5;
  cp_info *pcVar6;
  long lVar7;
  ostream *poVar8;
  Frame *this_02;
  Frame *pFVar9;
  Value VVar10;
  stack<Value,_std::deque<Value,_std::allocator<Value>_>_> local_288;
  undefined1 local_231;
  vector<Value,_std::allocator<Value>_> local_230;
  string local_218 [32];
  string local_1f8 [32];
  Frame *local_1d8;
  Frame *newFrame;
  ClassRuntime *classRuntime;
  MethodArea *methodArea;
  __normal_iterator<Value_*,_std::vector<Value,_std::allocator<Value>_>_> local_1b8;
  const_iterator local_1b0;
  Value *local_1a8;
  __normal_iterator<Value_*,_std::vector<Value,_std::allocator<Value>_>_> local_1a0;
  __normal_iterator<Value_*,_std::vector<Value,_std::allocator<Value>_>_> local_198;
  const_iterator local_190;
  undefined1 local_188 [8];
  Value value;
  undefined1 local_170 [4];
  int i_1;
  vector<Value,_std::allocator<Value>_> args;
  char baseType;
  uint16_t i;
  uint16_t nargs;
  string local_148 [8];
  string methodDescriptor;
  allocator local_121;
  string local_120 [8];
  string methodName;
  u2 local_fc;
  u2 uStack_fa;
  char cStack_f8;
  CONSTANT_NameAndType_info methodNameAndType;
  cp_info nameAndTypeCP;
  string local_d8 [8];
  string className;
  u2 local_b4;
  ushort uStack_b2;
  char cStack_b0;
  CONSTANT_Methodref_info methodInfo;
  cp_info methodCP;
  uint16_t methodIndex;
  u1 byte2;
  u1 byte1;
  u1 *code;
  cp_info *constantPool;
  stack<Value,_std::deque<Value,_std::allocator<Value>_>_> operandStackBackup;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_01 = VMStack::getInstance();
  operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)VMStack::getTopFrame(this_01);
  Frame::backupOperandStack
            ((stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&constantPool,
             (Frame *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node);
  ppcVar3 = Frame::getConstantPool
                      ((Frame *)operandStackBackup.c.
                                super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_node);
  constantPool_00 = *ppcVar3;
  puVar4 = Frame::getCode((Frame *)operandStackBackup.c.
                                   super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                                   super__Deque_impl_data._M_finish._M_node,
                          *(uint32_t *)
                           operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>.
                           _M_impl.super__Deque_impl_data._M_finish._M_node);
  methodCP.info._14_2_ = CONCAT11(puVar4[1],puVar4[2]);
  CVar1 = constantPool_00[(int)(CONCAT22(0,methodCP.info._14_2_) - 1)].info.long_info;
  cStack_b0 = (char)*(undefined8 *)(constantPool_00 + (int)(CONCAT22(0,methodCP.info._14_2_) - 1));
  if (cStack_b0 != '\n') {
    __assert_fail("methodCP.tag == CONSTANT_Methodref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x100f,"void ExecutionEngine::i_invokestatic()");
  }
  local_b4 = (u2)CVar1.high_bytes;
  pcVar5 = getFormattedConstant(constantPool_00,local_b4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,pcVar5,(allocator *)((long)&nameAndTypeCP.info + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)((long)&nameAndTypeCP.info + 0xf));
  uStack_b2 = CVar1.high_bytes._2_2_;
  pcVar6 = constantPool_00 + (int)(uStack_b2 - 1);
  CVar1 = (pcVar6->info).long_info;
  nameAndTypeCP.info.long_info = *(CONSTANT_Long_info *)((long)&pcVar6->info + 8);
  cStack_f8 = (char)*(undefined8 *)pcVar6;
  nameAndTypeCP._0_8_ = CVar1;
  if (cStack_f8 == '\f') {
    local_fc = (u2)CVar1.high_bytes;
    pcVar5 = getFormattedConstant(constantPool_00,local_fc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,pcVar5,&local_121);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    uStack_fa = CVar1.high_bytes._2_2_;
    pcVar5 = getFormattedConstant(constantPool_00,uStack_fa);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,pcVar5,(allocator *)((long)&nargs + 1));
    std::allocator<char>::~allocator((allocator<char> *)((long)&nargs + 1));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8,"java/lang/Object");
    if ((bVar2) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_120,"registerNatives"), bVar2)) {
      *(int *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node =
           *(int *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node + 3;
    }
    else {
      lVar7 = std::__cxx11::string::find((char *)local_d8,0x15050d);
      if (lVar7 != -1) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Tentando invocar metodo estatico invalido: "
                                );
        poVar8 = std::operator<<(poVar8,local_120);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._6_2_ = 0;
      args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_2_ = 1;
      while (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_148), *pcVar5 != ')') {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_148);
        args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._3_1_ = *pcVar5;
        if ((args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._3_1_ == 'D') ||
           (args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._3_1_ == 'J')) {
          args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._6_2_ =
               args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._6_2_ + 2;
        }
        else if (args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._3_1_ == 'L') {
          args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._6_2_ =
               args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._6_2_ + 1;
          do {
            args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_2_ =
                 args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_2_ + 1;
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_148);
          } while (*pcVar5 != ';');
        }
        else if (args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._3_1_ == '[') {
          args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._6_2_ =
               args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._6_2_ + 1;
          do {
            args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_2_ =
                 args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_2_ + 1;
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_148);
          } while (*pcVar5 == '[');
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_148);
          if (*pcVar5 == 'L') {
            do {
              args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage._4_2_ =
                   args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_2_ + 1;
              pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_148);
            } while (*pcVar5 != ';');
          }
        }
        else {
          args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._6_2_ =
               args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._6_2_ + 1;
        }
        args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_2_ =
             args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_2_ + 1;
      }
      std::vector<Value,_std::allocator<Value>_>::vector
                ((vector<Value,_std::allocator<Value>_> *)local_170);
      for (value.data.longValue._4_4_ = 0;
          value.data._4_4_ <
          (int)(uint)args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._6_2_;
          value.data.longValue._4_4_ = value.data.longValue._4_4_ + 1) {
        VVar10 = Frame::popTopOfOperandStack
                           ((Frame *)operandStackBackup.c.
                                     super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                                     super__Deque_impl_data._M_finish._M_node);
        value._0_8_ = VVar10.data;
        local_188._4_4_ = VVar10.type;
        local_188 = (undefined1  [8])VVar10._0_8_;
        if (local_188._4_4_ == PADDING) {
          local_1a0._M_current =
               (Value *)std::vector<Value,_std::allocator<Value>_>::begin
                                  ((vector<Value,_std::allocator<Value>_> *)local_170);
          local_198 = __gnu_cxx::
                      __normal_iterator<Value_*,_std::vector<Value,_std::allocator<Value>_>_>::
                      operator+(&local_1a0,1);
          __gnu_cxx::__normal_iterator<Value_const*,std::vector<Value,std::allocator<Value>>>::
          __normal_iterator<Value*>
                    ((__normal_iterator<Value_const*,std::vector<Value,std::allocator<Value>>> *)
                     &local_190,&local_198);
          local_1a8 = (Value *)std::vector<Value,_std::allocator<Value>_>::insert
                                         ((vector<Value,_std::allocator<Value>_> *)local_170,
                                          local_190,(value_type *)local_188);
        }
        else {
          local_1b8._M_current =
               (Value *)std::vector<Value,_std::allocator<Value>_>::begin
                                  ((vector<Value,_std::allocator<Value>_> *)local_170);
          __gnu_cxx::__normal_iterator<Value_const*,std::vector<Value,std::allocator<Value>>>::
          __normal_iterator<Value*>
                    ((__normal_iterator<Value_const*,std::vector<Value,std::allocator<Value>>> *)
                     &local_1b0,&local_1b8);
          methodArea = (MethodArea *)
                       std::vector<Value,_std::allocator<Value>_>::insert
                                 ((vector<Value,_std::allocator<Value>_> *)local_170,local_1b0,
                                  (value_type *)local_188);
        }
      }
      classRuntime = (ClassRuntime *)MethodArea::getInstance();
      newFrame = (Frame *)MethodArea::loadClassNamed((MethodArea *)classRuntime,(string *)local_d8);
      this_02 = (Frame *)operator_new(0xb8);
      pFVar9 = newFrame;
      local_231 = 1;
      std::__cxx11::string::string(local_1f8,local_120);
      std::__cxx11::string::string(local_218,local_148);
      std::vector<Value,_std::allocator<Value>_>::vector
                (&local_230,(vector<Value,_std::allocator<Value>_> *)local_170);
      Frame::Frame(this_02,(ClassRuntime *)pFVar9,(string *)local_1f8,(string *)local_218,&local_230
                  );
      local_231 = 0;
      std::vector<Value,_std::allocator<Value>_>::~vector(&local_230);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_1f8);
      local_1d8 = this_02;
      pFVar9 = VMStack::getTopFrame(this_01);
      this_00 = operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      if (pFVar9 == (Frame *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>.
                             _M_impl.super__Deque_impl_data._M_finish._M_node) {
        VMStack::addFrame(this_01,local_1d8);
        bVar2 = false;
      }
      else {
        std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::stack
                  (&local_288,
                   (stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&constantPool);
        Frame::setOperandStackFromBackup((Frame *)this_00,&local_288);
        std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::~stack(&local_288);
        pFVar9 = local_1d8;
        if (local_1d8 != (Frame *)0x0) {
          Frame::~Frame(local_1d8);
          operator_delete(pFVar9);
        }
        bVar2 = true;
      }
      std::vector<Value,_std::allocator<Value>_>::~vector
                ((vector<Value,_std::allocator<Value>_> *)local_170);
      if (!bVar2) {
        *(int *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node =
             *(int *)operandStackBackup.c.super__Deque_base<Value,_std::allocator<Value>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 3;
      }
    }
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_d8);
    std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::~stack
              ((stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&constantPool);
    return;
  }
  __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x1016,"void ExecutionEngine::i_invokestatic()");
}

Assistant:

void ExecutionEngine::i_invokestatic() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    stack<Value> operandStackBackup = topFrame->backupOperandStack();
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t methodIndex = (byte1 << 8) | byte2;
    cp_info methodCP = constantPool[methodIndex-1];
    assert(methodCP.tag == CONSTANT_Methodref); // precisa referenciar um método

    CONSTANT_Methodref_info methodInfo = methodCP.info.methodref_info;

    string className = getFormattedConstant(constantPool, methodInfo.class_index);

    cp_info nameAndTypeCP = constantPool[methodInfo.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info methodNameAndType = nameAndTypeCP.info.nameAndType_info;

    string methodName = getFormattedConstant(constantPool, methodNameAndType.name_index);
    string methodDescriptor = getFormattedConstant(constantPool, methodNameAndType.descriptor_index);

    if (className == "java/lang/Object" && methodName == "registerNatives") {
        topFrame->pc += 3;
        return;
    }
    
    if (className.find("java/") != string::npos) {
        cerr << "Tentando invocar metodo estatico invalido: " << methodName << endl;
        exit(1);
    } else {
        uint16_t nargs = 0; // numero de argumentos contidos na pilha de operandos
        uint16_t i = 1; // pulando o primeiro '('
        while (methodDescriptor[i] != ')') {
            char baseType = methodDescriptor[i];
            if (baseType == 'D' || baseType == 'J') {
                nargs += 2;
            } else if (baseType == 'L') {
                nargs++;
                while (methodDescriptor[++i] != ';');
            } else if (baseType == '[') {
                nargs++;
                while (methodDescriptor[++i] == '[');
                if (methodDescriptor[i] == 'L') while (methodDescriptor[++i] != ';');
            } else {
                nargs++;
            }
            i++;
        }

        vector<Value> args;
        for (int i = 0; i < nargs; i++) {
            Value value = topFrame->popTopOfOperandStack();
            if (value.type == ValueType::PADDING) {
                args.insert(args.begin() + 1, value); // adicionando o padding após o valor double/long.
            } else {
                args.insert(args.begin(), value);
            }
        }

        MethodArea &methodArea = MethodArea::getInstance();
        ClassRuntime *classRuntime = methodArea.loadClassNamed(className);
        Frame *newFrame = new Frame(classRuntime, methodName, methodDescriptor, args);

        // se a stack frame mudou, é porque teve <clinit> adicionado, então terminar a execução da instrução para eles serem executados.
        if (stackFrame.getTopFrame() != topFrame) {
            topFrame->setOperandStackFromBackup(operandStackBackup);
            delete newFrame;
            return;
        }

        stackFrame.addFrame(newFrame);
    }

    topFrame->pc += 3;
}